

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QToolBarAreaLayoutInfo::gapIndex
          (QList<int> *__return_storage_ptr__,QToolBarAreaLayoutInfo *this,QPoint *pos,
          int *minDistance)

{
  QToolBarAreaLayoutLine *this_00;
  Orientation OVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar7;
  QToolBarAreaLayoutLine *pQVar4;
  long lVar5;
  QLayoutItem *pQVar6;
  QSize QVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  QSize QVar13;
  Representation RVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar9 = QRect::contains((QPoint *)&this->rect,SUB81(pos,0));
  if (cVar9 == '\0') {
    iVar11 = distance(this,pos);
    if ((-1 < iVar11) && (iVar11 < *minDistance)) {
      *minDistance = iVar11;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      local_3c = (int)(this->lines).d.size;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
      QList<int>::end(__return_storage_ptr__);
      local_3c = 0;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_3c);
      QList<int>::end(__return_storage_ptr__);
      goto LAB_004b05dc;
    }
  }
  else {
    uVar3 = (this->rect).x1;
    uVar7 = (this->rect).y1;
    iVar11 = (pos->yp).m_i - uVar7;
    if (this->o == Horizontal) {
      iVar11 = (pos->xp).m_i - uVar3;
    }
    if ((this->lines).d.size != 0) {
      lVar15 = 0;
      uVar16 = 0;
      do {
        pQVar4 = (this->lines).d.ptr;
        this_00 = (QToolBarAreaLayoutLine *)((long)&(pQVar4->rect).x1.m_i + lVar15);
        bVar10 = QToolBarAreaLayoutLine::skip(this_00);
        if ((!bVar10) && (cVar9 = QRect::contains((QPoint *)this_00,SUB81(pos,0)), cVar9 != '\0')) {
          if (*(long *)((long)&(pQVar4->toolBarItems).d.size + lVar15) != 0) {
            lVar17 = 0;
            uVar18 = 0;
            goto LAB_004b04e6;
          }
          uVar18 = 0;
          goto LAB_004b0585;
        }
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x30;
      } while (uVar16 < (ulong)(this->lines).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  goto LAB_004b05fe;
LAB_004b04e6:
  do {
    lVar5 = *(long *)((long)&(pQVar4->toolBarItems).d.ptr + lVar15);
    if ((*(char *)(lVar5 + 0x14 + lVar17) != '\0') ||
       ((pQVar6 = ((QToolBarAreaLayoutItem *)(lVar17 + lVar5))->widgetItem,
        pQVar6 != (QLayoutItem *)0x0 &&
        (iVar12 = (*pQVar6->_vptr_QLayoutItem[8])(), (char)iVar12 == '\0')))) {
      OVar1 = this->o;
      QVar13 = QToolBarAreaLayoutItem::sizeHint((QToolBarAreaLayoutItem *)(lVar17 + lVar5));
      QVar8 = (QSize)((ulong)QVar13 >> 0x20);
      if (OVar1 == Horizontal) {
        QVar8 = QVar13;
      }
      iVar12 = *(int *)(lVar5 + 8 + lVar17);
      iVar2 = *(int *)(lVar5 + 0xc + lVar17);
      RVar14.m_i = QVar8.wd.m_i.m_i;
      if (iVar2 < QVar8.wd.m_i.m_i) {
        RVar14.m_i = iVar2;
      }
      if (iVar11 <= RVar14.m_i + iVar12) {
        uVar18 = (ulong)((int)uVar18 + (uint)(RVar14.m_i / 2 + iVar12 < iVar11));
        break;
      }
    }
    uVar18 = uVar18 + 1;
    lVar17 = lVar17 + 0x18;
  } while (uVar18 < *(ulong *)((long)&(pQVar4->toolBarItems).d.size + lVar15));
LAB_004b0585:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_3c = (int)uVar16;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
  QList<int>::end(__return_storage_ptr__);
  local_3c = (int)uVar18;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_3c)
  ;
  QList<int>::end(__return_storage_ptr__);
  *minDistance = 0;
LAB_004b05dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004b05fe:
  __stack_chk_fail();
}

Assistant:

QList<int> QToolBarAreaLayoutInfo::gapIndex(const QPoint &pos, int *minDistance) const
{
    if (rect.contains(pos)) {
        // <pos> is in QToolBarAreaLayout coordinates.
        // <item.pos> is in local dockarea coordinates (see ~20 lines below)
        // Since we're comparing p with item.pos, we put them in the same coordinate system.
        const int p = pick(o, pos - rect.topLeft());

        for (int j = 0; j < lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = lines.at(j);
            if (line.skip())
                continue;
            if (!line.rect.contains(pos))
                continue;

            int k = 0;
            for (; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip())
                    continue;

                int size = qMin(item.size, pick(o, item.sizeHint()));

                if (p > item.pos + size)
                    continue;
                if (p > item.pos + size/2)
                    ++k;
                break;
            }

            QList<int> result;
            result << j << k;
            *minDistance = 0; //we found a perfect match
            return result;
        }
    } else {
        const int dist = distance(pos);
        //it will only return a path if the minDistance is higher than the current distance
        if (dist >= 0 && *minDistance > dist) {
            *minDistance = dist;

            QList<int> result;
            result << lines.size() << 0;
            return result;
        }
    }

    return QList<int>();
}